

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNodeChain<QCss::StyleRule>::free
          (MultiNodeChain<QCss::StyleRule> *this,void *__ptr)

{
  MultiNodeChain<QCss::StyleRule> *pMVar1;
  
  while (this != (MultiNodeChain<QCss::StyleRule> *)0x0) {
    pMVar1 = this->next;
    QCss::StyleRule::~StyleRule(&this->value);
    operator_delete(this,0x40);
    this = pMVar1;
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }